

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImage.cpp
# Opt level: O3

void __thiscall
irr::video::CImage::copyToScaling
          (CImage *this,void *target,u32 width,u32 height,ECOLOR_FORMAT format,u32 pitch)

{
  uint uVar1;
  u32 uVar2;
  u32 uVar3;
  int iVar4;
  u32 uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float local_6c;
  float local_68;
  
  if (((height != 0 && (width != 0 && target != (void *)0x0)) &&
      ((this->super_IImage).Size.Width != 0)) && ((this->super_IImage).Size.Height != 0)) {
    uVar3 = IImage::getBitsPerPixelFromFormat(format);
    uVar2 = (uVar3 >> 3) * width;
    if (pitch != 0) {
      uVar2 = pitch;
    }
    iVar4 = (*(this->super_IImage)._vptr_IImage[4])
                      (this,target,(ulong)width,(ulong)height,(ulong)format);
    if ((char)iVar4 == '\0') {
      uVar1 = (this->super_IImage).Size.Width;
      if (width % uVar1 == 0) {
        fVar10 = (float)uVar1 / (float)width;
        local_68 = 0.0;
      }
      else {
        local_68 = 0.5;
        fVar10 = 0.0;
        if (1 < width) {
          fVar10 = (float)(uVar1 - 1) / (float)(width - 1);
        }
      }
      uVar1 = (this->super_IImage).Size.Height;
      if (height % uVar1 == 0) {
        local_6c = (float)uVar1 / (float)height;
        fVar11 = 0.0;
      }
      else {
        fVar11 = 0.5;
        local_6c = 0.0;
        if (1 < height) {
          local_6c = (float)(uVar1 - 1) / (float)(height - 1);
        }
      }
      uVar5 = 0;
      iVar4 = 0;
      iVar6 = 0;
      do {
        uVar7 = 0;
        uVar8 = (ulong)width;
        fVar9 = local_68;
        do {
          CColorConverter::convert_viaFormat
                    ((this->super_IImage).Data +
                     (ulong)((int)fVar9 * (this->super_IImage).BytesPerPixel) + (long)iVar4,
                     (this->super_IImage).Format,1,(void *)((long)target + uVar7 + (long)iVar6),
                     format);
          fVar9 = fVar9 + fVar10;
          uVar7 = (ulong)((int)uVar7 + (uVar3 >> 3));
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
        fVar11 = fVar11 + local_6c;
        iVar4 = (int)fVar11 * (this->super_IImage).Pitch;
        iVar6 = iVar6 + uVar2;
        uVar5 = uVar5 + 1;
      } while (uVar5 != height);
    }
  }
  return;
}

Assistant:

void CImage::copyToScaling(void *target, u32 width, u32 height, ECOLOR_FORMAT format, u32 pitch)
{
	if (IImage::isCompressedFormat(Format)) {
		os::Printer::log("IImage::copyToScaling method doesn't work with compressed images.", ELL_WARNING);
		return;
	}

	if (!target || !width || !height || !Size.Width || !Size.Height)
		return;

	const u32 bpp = getBitsPerPixelFromFormat(format) / 8;
	if (0 == pitch)
		pitch = width * bpp;

	if (copyToNoScaling(target, width, height, format, pitch))
		return;

	// NOTE: Scaling is coded to keep the border pixels intact.
	// Alternatively we could for example work with first pixel being taken at half step-size.
	// Then we have one more step here and it would be:
	//     sourceXStep = (f32)(Size.Width-1) / (f32)(width);
	//     And sx would start at 0.5f + sourceXStep / 2.f;
	//     Similar for y.
	// As scaling is done without any antialiasing it doesn't matter too much which outermost pixels we use and keeping
	// border pixels intact is probably mostly better (with AA the other solution would be more correct).
	// This is however unnecessary (and unexpected) for scaling to integer multiples, so don't do it there.
	f32 sourceXStep, sourceYStep;
	f32 sourceXStart = 0.f, sourceYStart = 0.f;
	if (width % Size.Width == 0)
		sourceXStep = (f32)(Size.Width) / (f32)(width);
	else {
		sourceXStep = width > 1 ? (f32)(Size.Width - 1) / (f32)(width - 1) : 0.f;
		sourceXStart = 0.5f; // for rounding to nearest pixel
	}
	if (height % Size.Height == 0)
		sourceYStep = (f32)(Size.Height) / (f32)(height);
	else {
		sourceYStep = height > 1 ? (f32)(Size.Height - 1) / (f32)(height - 1) : 0.f;
		sourceYStart = 0.5f; // for rounding to nearest pixel
	}

	s32 yval = 0, syval = 0;
	f32 sy = sourceYStart;
	for (u32 y = 0; y < height; ++y) {
		f32 sx = sourceXStart;
		for (u32 x = 0; x < width; ++x) {
			CColorConverter::convert_viaFormat(Data + syval + ((s32)sx) * BytesPerPixel, Format, 1, ((u8 *)target) + yval + (x * bpp), format);
			sx += sourceXStep;
		}
		sy += sourceYStep;
		syval = (s32)(sy)*Pitch;
		yval += pitch;
	}
}